

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

fdb_status fdb_free_snap_markers(fdb_snapshot_info_t *markers,uint64_t size)

{
  fdb_status fVar1;
  long lVar2;
  long lVar3;
  uint64_t uVar4;
  
  fVar1 = FDB_RESULT_INVALID_ARGS;
  if (size != 0 && markers != (fdb_snapshot_info_t *)0x0) {
    uVar4 = 0;
    do {
      lVar3 = markers[uVar4].num_kvs_markers;
      if (lVar3 != 0) {
        if (0 < lVar3) {
          lVar2 = lVar3 + 1;
          lVar3 = lVar3 << 4;
          do {
            free(*(void **)((long)&markers[uVar4].kvs_markers[-1].kv_store_name + lVar3));
            lVar2 = lVar2 + -1;
            lVar3 = lVar3 + -0x10;
          } while (1 < lVar2);
        }
        free(markers[uVar4].kvs_markers);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != size);
    free(markers);
    fVar1 = FDB_RESULT_SUCCESS;
  }
  return fVar1;
}

Assistant:

LIBFDB_API
fdb_status fdb_free_snap_markers(fdb_snapshot_info_t *markers, uint64_t size) {
    uint64_t i;
    int64_t kvs_idx;
    if (!markers || !size) {
        return FDB_RESULT_INVALID_ARGS;
    }
    for (i = 0; i < size; ++i) {
        kvs_idx = markers[i].num_kvs_markers;
        if (kvs_idx) {
            for (kvs_idx = kvs_idx - 1; kvs_idx >=0; --kvs_idx) {
                free(markers[i].kvs_markers[kvs_idx].kv_store_name);
            }
            free(markers[i].kvs_markers);
        }
    }
    free(markers);
    return FDB_RESULT_SUCCESS;
}